

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall Dialog::~Dialog(Dialog *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  this->display = (ALLEGRO_DISPLAY *)0x0;
  al_destroy_event_queue(this->event_queue);
  this->event_queue = (ALLEGRO_EVENT_QUEUE *)0x0;
  p_Var2 = (this->all_widgets).super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node
           .super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->all_widgets) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

Dialog::~Dialog()
{
   this->display = NULL;

   al_destroy_event_queue(this->event_queue);
   this->event_queue = NULL;
}